

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O0

SubcaseBasePtr deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::OffsetsGatherUint2D>(void)

{
  GatherBase *pGVar1;
  TGBase *pTVar2;
  OffsetsGatherUint2D *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar3;
  
  this = (OffsetsGatherUint2D *)operator_new(0x60);
  (this->super_OffsetGatherUint2D).super_PlainGatherUint2D.super_GatherBase.rbo = 0;
  (this->super_OffsetGatherUint2D).super_PlainGatherUint2D.super_GatherBase.program = 0;
  (this->super_OffsetGatherUint2D).super_PlainGatherUint2D.super_GatherBase.vao = 0;
  (this->super_OffsetGatherUint2D).super_PlainGatherUint2D.super_GatherBase.vbo = 0;
  pTVar2 = &(this->super_OffsetGatherUint2D).super_PlainGatherUint2D.super_GatherBase.super_TGBase;
  (pTVar2->g_color_eps).m_data[2] = 0.0;
  (pTVar2->g_color_eps).m_data[3] = 0.0;
  (this->super_OffsetGatherUint2D).super_PlainGatherUint2D.super_GatherBase.tex = 0;
  (this->super_OffsetGatherUint2D).super_PlainGatherUint2D.super_GatherBase.fbo = 0;
  (this->super_OffsetGatherUint2D).super_PlainGatherUint2D.super_GatherBase.super_TGBase.pixelFormat
       = (PixelFormat *)0x0;
  pGVar1 = &(this->super_OffsetGatherUint2D).super_PlainGatherUint2D.super_GatherBase;
  (pGVar1->super_TGBase).g_color_eps.m_data[0] = 0.0;
  (pGVar1->super_TGBase).g_color_eps.m_data[1] = 0.0;
  (this->super_OffsetGatherUint2D).super_PlainGatherUint2D.super_GatherBase.super_TGBase.
  super_SubcaseBase.super_GLWrapper.m_context = (Context *)0x0;
  (this->super_OffsetGatherUint2D).super_PlainGatherUint2D.super_GatherBase.super_TGBase.
  renderTarget = (RenderTarget *)0x0;
  *(TestLog **)
   ((long)&(this->super_OffsetGatherUint2D).super_PlainGatherUint2D.super_GatherBase.super_TGBase.
           super_SubcaseBase.super_GLWrapper.super_CallLogWrapper + 8) = (TestLog *)0x0;
  *(undefined8 *)
   ((long)&(this->super_OffsetGatherUint2D).super_PlainGatherUint2D.super_GatherBase.super_TGBase.
           super_SubcaseBase.super_GLWrapper.super_CallLogWrapper + 0x10) = 0;
  (this->super_OffsetGatherUint2D).super_PlainGatherUint2D.super_GatherBase.super_TGBase.
  super_SubcaseBase.super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  (this->super_OffsetGatherUint2D).super_PlainGatherUint2D.super_GatherBase.super_TGBase.
  super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_gl = (Functions *)0x0;
  gl4cts::anon_unknown_0::OffsetsGatherUint2D::OffsetsGatherUint2D(this);
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar3.m_state = extraout_RDX;
  SVar3.m_ptr = (SubcaseBase *)in_RDI;
  return SVar3;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}